

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

void __thiscall
testing::Action<pstore::address_(unsigned_long,_unsigned_int)>::
Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>,_void>
          (Action<pstore::address_(unsigned_long,_unsigned_int)> *this,
          InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>
          *fun)

{
  offset_in_mock_database_to_subr oVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 *puVar6;
  _func_address__Any_data_ptr_unsigned_long_ptr_uint_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  _Any_data __tmp;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  (this->fun_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->fun_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->fun_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->fun_).super__Function_base._M_functor + 8) = 0;
  local_38 = (_Manager_type)0x0;
  p_Stack_30 = (_Invoker_type)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  puVar6 = (undefined8 *)operator_new(0x18);
  puVar6[2] = *(undefined8 *)&fun->field_0x10;
  oVar1 = fun->method_ptr;
  *puVar6 = fun->obj_ptr;
  puVar6[1] = oVar1;
  local_48._0_4_ = SUB84(puVar6,0);
  uVar2 = local_48._0_4_;
  local_48._4_4_ = (undefined4)((ulong)puVar6 >> 0x20);
  uVar3 = local_48._4_4_;
  uVar4 = local_48._8_4_;
  uVar5 = local_48._12_4_;
  local_28 = local_48._0_4_;
  uStack_24 = local_48._4_4_;
  uStack_20 = local_48._8_4_;
  uStack_1c = local_48._12_4_;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  *(undefined4 *)&(this->fun_).super__Function_base._M_functor = uVar2;
  *(undefined4 *)((long)&(this->fun_).super__Function_base._M_functor + 4) = uVar3;
  *(undefined4 *)((long)&(this->fun_).super__Function_base._M_functor + 8) = uVar4;
  *(undefined4 *)((long)&(this->fun_).super__Function_base._M_functor + 0xc) = uVar5;
  local_38 = (this->fun_).super__Function_base._M_manager;
  (this->fun_).super__Function_base._M_manager =
       std::
       _Function_handler<pstore::address_(unsigned_long,_unsigned_int),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>_>
       ::_M_manager;
  p_Stack_30 = (this->fun_)._M_invoker;
  (this->fun_)._M_invoker =
       std::
       _Function_handler<pstore::address_(unsigned_long,_unsigned_int),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>_>
       ::_M_invoke;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

Action(G&& fun) {  // NOLINT
    Init(::std::forward<G>(fun), IsCompatibleFunctor<G>());
  }